

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnData::FetchRow
          (StandardColumnData *this,TransactionData transaction,ColumnFetchState *state,row_t row_id
          ,Vector *result,idx_t result_idx)

{
  reference this_00;
  type pCVar1;
  ColumnSegment *pCVar2;
  __uniq_ptr_impl<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_> local_40
  ;
  ColumnData *local_38;
  
  if ((state->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (state->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_40._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
    .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl =
         (tuple<duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>)
         operator_new(0x50);
    *(long *)((long)local_40._M_t.
                    super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
                    .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x20) =
         0;
    *(size_t *)
     ((long)local_40._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
            .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x28) = 0;
    *(__node_base_ptr **)
     local_40._M_t.
     super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
     .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl =
         (__node_base_ptr *)
         ((long)local_40._M_t.
                super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
                .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x30);
    *(size_type *)
     ((long)local_40._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
            .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 8) = 1;
    ((__node_base *)
    ((long)local_40._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
           .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x10))->_M_nxt =
         (_Hash_node_base *)0x0;
    *(size_type *)
     ((long)local_40._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
            .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x18) = 0;
    ((_Prime_rehash_policy *)
    ((long)local_40._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
           .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x20))->
    _M_max_load_factor = 1.0;
    (((vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
       *)((long)local_40._M_t.
                super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
                .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x38))->
    super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
    ).
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)local_40._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
            .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x40) =
         (pointer)0x0;
    *(size_t *)
     ((long)local_40._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
            .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x28) = 0;
    *(__node_base_ptr *)
     ((long)local_40._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
            .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x30) =
         (__node_base_ptr)0x0;
    *(pointer *)
     ((long)local_40._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
            .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl + 0x48) =
         (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>>
                *)&state->child_states,
               (unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
                *)&local_40);
    ::std::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
                 *)&local_40);
  }
  local_38 = &(this->validity).super_ColumnData;
  this_00 = vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
            ::operator[](&state->child_states,0);
  pCVar1 = unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
           ::operator*(this_00);
  pCVar2 = SegmentTree<duckdb::ColumnSegment,_false>::GetSegment
                     (&(this->validity).super_ColumnData.data.
                       super_SegmentTree<duckdb::ColumnSegment,_false>,row_id);
  (*((pCVar2->function)._M_data)->fetch_row)
            (pCVar2,pCVar1,row_id - (pCVar2->super_SegmentBase<duckdb::ColumnSegment>).start,result,
             result_idx);
  ColumnData::FetchUpdateRow(local_38,transaction,row_id,result,result_idx);
  pCVar2 = SegmentTree<duckdb::ColumnSegment,_false>::GetSegment
                     (&(this->super_ColumnData).data.super_SegmentTree<duckdb::ColumnSegment,_false>
                      ,row_id);
  (*((pCVar2->function)._M_data)->fetch_row)
            (pCVar2,state,row_id - (pCVar2->super_SegmentBase<duckdb::ColumnSegment>).start,result,
             result_idx);
  ColumnData::FetchUpdateRow(&this->super_ColumnData,transaction,row_id,result,result_idx);
  return;
}

Assistant:

void StandardColumnData::FetchRow(TransactionData transaction, ColumnFetchState &state, row_t row_id, Vector &result,
                                  idx_t result_idx) {
	// find the segment the row belongs to
	if (state.child_states.empty()) {
		auto child_state = make_uniq<ColumnFetchState>();
		state.child_states.push_back(std::move(child_state));
	}
	validity.FetchRow(transaction, *state.child_states[0], row_id, result, result_idx);
	ColumnData::FetchRow(transaction, state, row_id, result, result_idx);
}